

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O1

void __thiscall wabt::Token::Token(Token *this,Location loc,TokenType token_type,Literal *literal)

{
  pointer pcVar1;
  
  (this->loc).field_1.field_0.line = loc.field_1.field_0.line;
  (this->loc).field_1.field_0.first_column = loc.field_1.field_0.first_column;
  (this->loc).field_1.field_0.last_column = loc.field_1.field_0.last_column;
  *(undefined4 *)((long)&(this->loc).field_1 + 0xc) = loc.field_1._12_4_;
  *(undefined4 *)&(this->loc).filename.data_ = loc.filename.data_._0_4_;
  *(undefined4 *)((long)&(this->loc).filename.data_ + 4) = loc.filename.data_._4_4_;
  *(undefined4 *)&(this->loc).filename.size_ = (undefined4)loc.filename.size_;
  *(undefined4 *)((long)&(this->loc).filename.size_ + 4) = loc.filename.size_._4_4_;
  this->token_type_ = token_type;
  if (token_type - First_Literal < 3) {
    (this->field_2).opcode_.enum_ = literal->type;
    (this->field_2).text_._M_string_length = (size_type)((long)&this->field_2 + 0x18);
    pcVar1 = (literal->text)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&this->field_2 + 8),pcVar1,pcVar1 + (literal->text)._M_string_length
              );
    return;
  }
  __assert_fail("HasLiteral()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.cc"
                ,0x45,"wabt::Token::Token(Location, TokenType, const Literal &)");
}

Assistant:

Token::Token(Location loc, TokenType token_type, const Literal& literal)
    : loc(loc), token_type_(token_type) {
  assert(HasLiteral());
  Construct(literal_, literal);
}